

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mcu8str_view_cstr(mcu8str *__return_storage_ptr__,char *c_str)

{
  mcu8str_size_t mVar1;
  
  __return_storage_ptr__->c_str = c_str;
  mVar1 = mctools_strlen(c_str,0);
  __return_storage_ptr__->size = (uint)mVar1;
  __return_storage_ptr__->buflen = (uint)mVar1 + 1;
  __return_storage_ptr__->owns_memory = 0;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mcu8str_view_cstr( const char * c_str )
  {
    mcu8str s;
    s.c_str = (char*)c_str;//cast away constness, but we will add it again in
                           //the return type (in c++).
    s.size = (unsigned)mctools_strlen( c_str, 0 );//cast due to mctools_strlen
    s.buflen = s.size + 1;
    s.owns_memory = 0;
    return s;
  }